

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_reporting.hpp
# Opt level: O2

string * __thiscall
pstore::http::build_headers<std::pair<char_const*,char_const*>const*,void>
          (string *__return_storage_ptr__,http *this,pair<const_char_*,_const_char_*> *first,
          pair<const_char_*,_const_char_*> *last)

{
  ostream *poVar1;
  ostringstream os;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::
  for_each<std::pair<char_const*,char_const*>const*,pstore::http::build_headers<std::pair<char_const*,char_const*>const*,void>(std::pair<char_const*,char_const*>const*,std::pair<char_const*,char_const*>const*)::_lambda(std::pair<char_const*,char_const*>const&)_1_>
            ((pair<const_char_*,_const_char_*> *)this,first,(ostringstream *)aoStack_198);
  poVar1 = std::operator<<((ostream *)aoStack_198,"Server: ");
  poVar1 = std::operator<<(poVar1,"pstore-http");
  std::operator<<(poVar1,"\r\n");
  std::operator<<((ostream *)aoStack_198,"\r\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string build_headers (InputIterator first, InputIterator last) {
            std::ostringstream os;
            std::for_each (first, last, [&] (czstring_pair const & p) {
                os << p.first << ": " << p.second << crlf;
            });
            os << "Server: " << server_name << crlf;
            os << crlf;
            return os.str ();
        }